

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

void Aig_ManSeqCleanup_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  do {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar2 = uVar1 & 7;
    lVar3 = 8;
    if (1 < (ulong)uVar2 - 3) {
      if (uVar2 == 2) {
        Vec_PtrPush(vNodes,(pObj->field_0).pNext);
        return;
      }
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                      ,0x8e,"void Aig_ManSeqCleanup_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      Aig_ManSeqCleanup_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
      lVar3 = 0x10;
    }
    pObj = (Aig_Obj_t *)(*(ulong *)((long)&pObj->field_0 + lVar3) & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

void Aig_ManSeqCleanup_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    // collect latch input corresponding to unmarked PI (latch output)
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vNodes, pObj->pNext );
        return;
    }
    if ( Aig_ObjIsCo(pObj) || Aig_ObjIsBuf(pObj) )
    {
        Aig_ManSeqCleanup_rec( p, Aig_ObjFanin0(pObj), vNodes );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ManSeqCleanup_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManSeqCleanup_rec( p, Aig_ObjFanin1(pObj), vNodes );
}